

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O0

int wally_ec_sig_from_bytes
              (uchar *priv_key,size_t priv_key_len,uchar *bytes,size_t bytes_len,uint32_t flags,
              uchar *bytes_out,size_t len)

{
  secp256k1_nonce_function noncefp;
  _Bool _Var1;
  int iVar2;
  wally_operations *pwVar3;
  secp256k1_context *ctx_00;
  size_t sVar4;
  byte *local_e8;
  char local_d4 [7];
  undefined1 local_cd;
  int recid;
  secp256k1_ecdsa_recoverable_signature sig_secp;
  uint32_t counter;
  uchar *bytes_out_p;
  uchar *entropy_p;
  uchar extra_entropy [32];
  secp256k1_context *ctx;
  wally_ec_nonce_t nonce_fn;
  uchar *bytes_out_local;
  uint32_t flags_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  size_t priv_key_len_local;
  uchar *priv_key_local;
  
  pwVar3 = wally_ops();
  noncefp = pwVar3->ec_nonce_fn;
  ctx_00 = secp_ctx();
  if (((((priv_key == (uchar *)0x0) || (priv_key_len != 0x20)) || (bytes == (uchar *)0x0)) ||
      ((bytes_len != 0x20 || (_Var1 = is_valid_ec_type(flags), !_Var1)))) ||
     (((flags & 0xfffffff0) != 0 ||
      ((bytes_out == (uchar *)0x0 || (sVar4 = get_expected_sig_len(flags), len != sVar4)))))) {
    priv_key_local._4_4_ = -2;
  }
  else if (ctx_00 == (secp256k1_context *)0x0) {
    priv_key_local._4_4_ = -3;
  }
  else if ((flags & 2) == 0) {
    memset(&entropy_p,0,0x20);
    bytes_out_p = (uchar *)0x0;
    local_e8 = bytes_out;
    if ((flags & 8) != 0) {
      local_e8 = bytes_out + 1;
    }
    stack0xffffffffffffff78 = local_e8;
    sig_secp.data[0x39] = '\0';
    sig_secp.data[0x3a] = '\0';
    sig_secp.data[0x3b] = '\0';
    sig_secp.data[0x3c] = '\0';
    while (iVar2 = secp256k1_ecdsa_sign_recoverable
                             (ctx_00,(secp256k1_ecdsa_recoverable_signature *)&local_cd,bytes,
                              priv_key,noncefp,bytes_out_p), iVar2 != 0) {
      secp256k1_ecdsa_recoverable_signature_serialize_compact
                (ctx_00,stack0xffffffffffffff78,(int *)local_d4,
                 (secp256k1_ecdsa_recoverable_signature *)&local_cd);
      if (((flags & 4) == 0) || (*stack0xffffffffffffff78 < 0x80)) {
        wally_clear(&local_cd,0x41);
        if ((flags & 8) != 0) {
          *bytes_out = local_d4[0] + '\x1f';
        }
        return 0;
      }
      bytes_out_p = (uchar *)&entropy_p;
      sig_secp.data._57_4_ = sig_secp.data._57_4_ + 1;
      uint32_to_le_bytes(sig_secp.data._57_4_,bytes_out_p);
    }
    wally_clear(&local_cd,0x41);
    iVar2 = secp256k1_ec_seckey_verify(ctx_00,priv_key);
    if (iVar2 == 0) {
      priv_key_local._4_4_ = -2;
    }
    else {
      priv_key_local._4_4_ = -1;
    }
  }
  else if ((flags & 8) == 0) {
    priv_key_local._4_4_ = -2;
  }
  else {
    priv_key_local._4_4_ = -2;
  }
  return priv_key_local._4_4_;
}

Assistant:

int wally_ec_sig_from_bytes(const unsigned char *priv_key, size_t priv_key_len,
                            const unsigned char *bytes, size_t bytes_len,
                            uint32_t flags,
                            unsigned char *bytes_out, size_t len)
{
    wally_ec_nonce_t nonce_fn = wally_ops()->ec_nonce_fn;
    const secp256k1_context *ctx = secp_ctx();

    if (!priv_key || priv_key_len != EC_PRIVATE_KEY_LEN ||
        !bytes || bytes_len != EC_MESSAGE_HASH_LEN ||
        !is_valid_ec_type(flags) || flags & ~EC_FLAGS_ALL ||
        !bytes_out || len != get_expected_sig_len(flags))
        return WALLY_EINVAL;

    if (!ctx)
        return WALLY_ENOMEM;

    if (flags & EC_FLAG_SCHNORR) {
        if (flags & EC_FLAG_RECOVERABLE)
            return WALLY_EINVAL; /* Only ECDSA is supported for recoverable sigs */

#if 0 /*FIXME: Schnorr is unavailable in secp for now*/
        if (!secp256k1_schnorr_sign(ctx, bytes_out, bytes,
                                    priv_key, nonce_fn, NULL))
            return WALLY_EINVAL; /* Failed to sign */
        return WALLY_OK;
#endif
        return WALLY_EINVAL;
    } else {
        unsigned char extra_entropy[32] = {0}, *entropy_p = NULL;
        unsigned char *bytes_out_p = flags & EC_FLAG_RECOVERABLE ? bytes_out + 1 : bytes_out;
        uint32_t counter = 0;
        secp256k1_ecdsa_recoverable_signature sig_secp;
        int recid;

        while (true) {
            if (!secp256k1_ecdsa_sign_recoverable(ctx, &sig_secp, bytes, priv_key, nonce_fn, entropy_p)) {
                wally_clear(&sig_secp, sizeof(sig_secp));
                if (!secp256k1_ec_seckey_verify(ctx, priv_key))
                    return WALLY_EINVAL; /* invalid priv_key */
                return WALLY_ERROR;     /* Nonce function failed */
            }

            /* Note this function is documented as never failing */
            secp256k1_ecdsa_recoverable_signature_serialize_compact(ctx, bytes_out_p, &recid, &sig_secp);

            if (!(flags & EC_FLAG_GRIND_R) || *bytes_out_p < 0x80) {
                wally_clear(&sig_secp, sizeof(sig_secp));
                /* Note the following assumes the key is compressed */
                if (flags & EC_FLAG_RECOVERABLE)
                    bytes_out[0] = 27 + recid + 4;

                return WALLY_OK;
            }
            /* Incremement nonce to grind for low-R */
            entropy_p = extra_entropy;
            ++counter;
            uint32_to_le_bytes(counter, entropy_p);
        }
    }
}